

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredmesh.cc
# Opt level: O0

void __thiscall gvr::ColoredMesh::savePLY(ColoredMesh *this,char *name,bool all,ply_encoding enc)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int in_ECX;
  size_t sVar5;
  byte in_DL;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  int __fd;
  char *in_RSI;
  string *psVar6;
  ColoredMesh *in_RDI;
  int i_1;
  int i;
  PLYWriter ply;
  undefined4 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b4;
  byte in_stack_fffffffffffff9b5;
  byte in_stack_fffffffffffff9b6;
  byte in_stack_fffffffffffff9b7;
  undefined4 in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f4;
  string *in_stack_fffffffffffff9f8;
  allocator *paVar7;
  undefined4 in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa04;
  allocator *in_stack_fffffffffffffa70;
  undefined7 in_stack_fffffffffffffa78;
  undefined1 in_stack_fffffffffffffa7f;
  PLYWriter *in_stack_fffffffffffffa80;
  PLYWriter *this_00;
  int local_544;
  int local_540;
  allocator local_539;
  string local_538 [39];
  allocator local_511;
  string local_510 [39];
  allocator local_4e9;
  string local_4e8 [39];
  allocator local_4c1;
  string local_4c0 [39];
  allocator local_499;
  string local_498 [39];
  allocator local_471;
  string local_470 [39];
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [39];
  allocator<char> local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [16];
  PLYWriter *in_stack_fffffffffffffd58;
  Model *in_stack_fffffffffffffd60;
  allocator local_291;
  string local_290 [48];
  PLYWriter local_260;
  int local_18;
  byte local_11;
  char *local_10;
  
  local_11 = in_DL & 1;
  local_18 = in_ECX;
  local_10 = in_RSI;
  PLYWriter::PLYWriter
            ((PLYWriter *)
             CONCAT17(in_stack_fffffffffffff9b7,
                      CONCAT16(in_stack_fffffffffffff9b6,
                               CONCAT15(in_stack_fffffffffffff9b5,
                                        CONCAT14(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0
                                                )))));
  PLYWriter::open(&local_260,local_10,local_18);
  Model::setOriginToPLY(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"vertex",&local_291);
  PointCloud::getVertexCount((PointCloud *)in_RDI);
  PLYWriter::addElement
            ((PLYWriter *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
             in_stack_fffffffffffff9f8,CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0)
            );
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"x",&local_2b9);
  PLYWriter::addProperty
            (in_stack_fffffffffffffa80,
             (string *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
             (ply_type)((ulong)in_stack_fffffffffffffa70 >> 0x20));
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"y",&local_2e1);
  PLYWriter::addProperty
            (in_stack_fffffffffffffa80,
             (string *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
             (ply_type)((ulong)in_stack_fffffffffffffa70 >> 0x20));
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  this_00 = (PLYWriter *)&local_309;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"z",(allocator *)this_00);
  PLYWriter::addProperty
            (this_00,(string *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
             (ply_type)((ulong)in_stack_fffffffffffffa70 >> 0x20));
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator(&local_309);
  uVar1 = PointCloud::hasScanProp((PointCloud *)in_RDI);
  if ((bool)uVar1) {
    in_stack_fffffffffffffa70 = &local_331;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,"scan_size",in_stack_fffffffffffffa70);
    PLYWriter::addProperty
              (this_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffa78),
               (ply_type)((ulong)in_stack_fffffffffffffa70 >> 0x20));
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    if ((local_11 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_358,"scan_error",&local_359);
      PLYWriter::addProperty
                (this_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffa78),
                 (ply_type)((ulong)in_stack_fffffffffffffa70 >> 0x20));
      std::__cxx11::string::~string(local_358);
      std::allocator<char>::~allocator((allocator<char> *)&local_359);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_380,"scan_conf",&local_381);
      PLYWriter::addProperty
                (this_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffa78),
                 (ply_type)((ulong)in_stack_fffffffffffffa70 >> 0x20));
      std::__cxx11::string::~string(local_380);
      std::allocator<char>::~allocator((allocator<char> *)&local_381);
    }
  }
  if (((local_11 & 1) != 0) && (bVar2 = PointCloud::hasScanPos((PointCloud *)in_RDI), bVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3a8,"sx",&local_3a9);
    PLYWriter::addProperty
              (this_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffa78),
               (ply_type)((ulong)in_stack_fffffffffffffa70 >> 0x20));
    std::__cxx11::string::~string(local_3a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3d0,"sy",&local_3d1);
    PLYWriter::addProperty
              (this_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffa78),
               (ply_type)((ulong)in_stack_fffffffffffffa70 >> 0x20));
    std::__cxx11::string::~string(local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f8,"sz",&local_3f9);
    PLYWriter::addProperty
              (this_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffa78),
               (ply_type)((ulong)in_stack_fffffffffffffa70 >> 0x20));
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  }
  if ((local_11 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_420,"nx",&local_421);
    PLYWriter::addProperty
              (this_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffa78),
               (ply_type)((ulong)in_stack_fffffffffffffa70 >> 0x20));
    std::__cxx11::string::~string(local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_448,"ny",&local_449);
    PLYWriter::addProperty
              (this_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffa78),
               (ply_type)((ulong)in_stack_fffffffffffffa70 >> 0x20));
    std::__cxx11::string::~string(local_448);
    std::allocator<char>::~allocator((allocator<char> *)&local_449);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_470,"nz",&local_471);
    PLYWriter::addProperty
              (this_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffa78),
               (ply_type)((ulong)in_stack_fffffffffffffa70 >> 0x20));
    std::__cxx11::string::~string(local_470);
    std::allocator<char>::~allocator((allocator<char> *)&local_471);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_498,"diffuse_red",&local_499);
  PLYWriter::addProperty
            (this_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffa78),
             (ply_type)((ulong)in_stack_fffffffffffffa70 >> 0x20));
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c0,"diffuse_green",&local_4c1);
  PLYWriter::addProperty
            (this_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffa78),
             (ply_type)((ulong)in_stack_fffffffffffffa70 >> 0x20));
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e8,"diffuse_blue",&local_4e9);
  PLYWriter::addProperty
            (this_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffa78),
             (ply_type)((ulong)in_stack_fffffffffffffa70 >> 0x20));
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_510,"face",&local_511);
  iVar3 = Mesh::getTriangleCount(&in_RDI->super_Mesh);
  PLYWriter::addElement
            ((PLYWriter *)CONCAT44(iVar3,in_stack_fffffffffffffa00),in_stack_fffffffffffff9f8,
             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  paVar7 = &local_539;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"vertex_indices",paVar7);
  psVar6 = local_538;
  PLYWriter::addProperty
            (this_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffa78),
             (ply_type)((ulong)in_stack_fffffffffffffa70 >> 0x20),
             (ply_type)in_stack_fffffffffffffa70);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  local_540 = 0;
  while( true ) {
    iVar3 = local_540;
    uVar4 = PointCloud::getVertexCount((PointCloud *)in_RDI);
    sVar5 = (size_t)uVar4;
    if ((int)uVar4 <= iVar3) break;
    iVar3 = local_540;
    PointCloud::getVertexComp((PointCloud *)in_RDI,local_540,0);
    PLYWriter::write(&local_260,iVar3,__buf,sVar5);
    iVar3 = local_540;
    PointCloud::getVertexComp((PointCloud *)in_RDI,local_540,1);
    PLYWriter::write(&local_260,iVar3,__buf_00,sVar5);
    iVar3 = local_540;
    PointCloud::getVertexComp((PointCloud *)in_RDI,local_540,2);
    PLYWriter::write(&local_260,iVar3,__buf_01,sVar5);
    bVar2 = PointCloud::hasScanProp((PointCloud *)in_RDI);
    if (bVar2) {
      iVar3 = local_540;
      PointCloud::getScanSize((PointCloud *)in_RDI,local_540);
      PLYWriter::write(&local_260,iVar3,__buf_02,sVar5);
      if ((local_11 & 1) != 0) {
        iVar3 = local_540;
        PointCloud::getScanError((PointCloud *)in_RDI,local_540);
        PLYWriter::write(&local_260,iVar3,__buf_03,sVar5);
        iVar3 = local_540;
        PointCloud::getScanConf((PointCloud *)in_RDI,local_540);
        PLYWriter::write(&local_260,iVar3,__buf_04,sVar5);
      }
    }
    if (((local_11 & 1) != 0) && (bVar2 = PointCloud::hasScanPos((PointCloud *)in_RDI), bVar2)) {
      iVar3 = local_540;
      PointCloud::getScanPosComp((PointCloud *)in_RDI,local_540,0);
      PLYWriter::write(&local_260,iVar3,__buf_05,sVar5);
      iVar3 = local_540;
      PointCloud::getScanPosComp((PointCloud *)in_RDI,local_540,1);
      PLYWriter::write(&local_260,iVar3,__buf_06,sVar5);
      iVar3 = local_540;
      PointCloud::getScanPosComp((PointCloud *)in_RDI,local_540,2);
      PLYWriter::write(&local_260,iVar3,__buf_07,sVar5);
    }
    if ((local_11 & 1) != 0) {
      iVar3 = local_540;
      Mesh::getNormalComp(&in_RDI->super_Mesh,local_540,0);
      PLYWriter::write(&local_260,iVar3,__buf_08,sVar5);
      iVar3 = local_540;
      Mesh::getNormalComp(&in_RDI->super_Mesh,local_540,1);
      PLYWriter::write(&local_260,iVar3,__buf_09,sVar5);
      iVar3 = local_540;
      Mesh::getNormalComp(&in_RDI->super_Mesh,local_540,2);
      PLYWriter::write(&local_260,iVar3,__buf_10,sVar5);
    }
    in_stack_fffffffffffff9b7 = getColorComp(in_RDI,local_540,0);
    PLYWriter::write(&local_260,(uint)in_stack_fffffffffffff9b7,__buf_11,sVar5);
    in_stack_fffffffffffff9b6 = getColorComp(in_RDI,local_540,1);
    PLYWriter::write(&local_260,(uint)in_stack_fffffffffffff9b6,__buf_12,sVar5);
    in_stack_fffffffffffff9b5 = getColorComp(in_RDI,local_540,2);
    psVar6 = (string *)(ulong)in_stack_fffffffffffff9b5;
    PLYWriter::write(&local_260,(uint)in_stack_fffffffffffff9b5,__buf_13,sVar5);
    local_540 = local_540 + 1;
  }
  local_544 = 0;
  while( true ) {
    __fd = (int)psVar6;
    iVar3 = local_544;
    uVar4 = Mesh::getTriangleCount(&in_RDI->super_Mesh);
    sVar5 = (size_t)uVar4;
    if ((int)uVar4 <= iVar3) break;
    PLYWriter::writeListSize
              ((PLYWriter *)
               CONCAT17(in_stack_fffffffffffff9b7,
                        CONCAT16(in_stack_fffffffffffff9b6,
                                 CONCAT15(in_stack_fffffffffffff9b5,
                                          CONCAT14(in_stack_fffffffffffff9b4,uVar4)))),iVar3);
    uVar4 = Mesh::getTriangleIndex(&in_RDI->super_Mesh,local_544,0);
    PLYWriter::write(&local_260,uVar4,__buf_14,sVar5);
    uVar4 = Mesh::getTriangleIndex(&in_RDI->super_Mesh,local_544,1);
    PLYWriter::write(&local_260,uVar4,__buf_15,sVar5);
    uVar4 = Mesh::getTriangleIndex(&in_RDI->super_Mesh,local_544,2);
    psVar6 = (string *)(ulong)uVar4;
    PLYWriter::write(&local_260,uVar4,__buf_16,sVar5);
    local_544 = local_544 + 1;
  }
  PLYWriter::close(&local_260,__fd);
  PLYWriter::~PLYWriter
            ((PLYWriter *)
             CONCAT17(in_stack_fffffffffffff9b7,
                      CONCAT16(in_stack_fffffffffffff9b6,
                               CONCAT15(in_stack_fffffffffffff9b5,
                                        CONCAT14(in_stack_fffffffffffff9b4,uVar4)))));
  return;
}

Assistant:

void ColoredMesh::savePLY(const char *name, bool all, ply_encoding enc) const
{
  PLYWriter ply;

  ply.open(name, enc);

  // define data

  setOriginToPLY(ply);

  ply.addElement("vertex", getVertexCount());

  ply.addProperty("x", ply_float32);
  ply.addProperty("y", ply_float32);
  ply.addProperty("z", ply_float32);

  if (hasScanProp() != 0)
  {
    ply.addProperty("scan_size", ply_float32);

    if (all)
    {
      ply.addProperty("scan_error", ply_float32);
      ply.addProperty("scan_conf", ply_float32);
    }
  }

  if (all && hasScanPos() != 0)
  {
    ply.addProperty("sx", ply_float32);
    ply.addProperty("sy", ply_float32);
    ply.addProperty("sz", ply_float32);
  }

  if (all)
  {
    ply.addProperty("nx", ply_float32);
    ply.addProperty("ny", ply_float32);
    ply.addProperty("nz", ply_float32);
  }

  ply.addProperty("diffuse_red", ply_uint8);
  ply.addProperty("diffuse_green", ply_uint8);
  ply.addProperty("diffuse_blue", ply_uint8);

  ply.addElement("face", getTriangleCount());
  ply.addProperty("vertex_indices", ply_uint8, ply_uint32);

  // write data

  for (int i=0; i<getVertexCount(); i++)
  {
    ply.write(getVertexComp(i, 0));
    ply.write(getVertexComp(i, 1));
    ply.write(getVertexComp(i, 2));

    if (hasScanProp() != 0)
    {
      ply.write(getScanSize(i));

      if (all)
      {
        ply.write(getScanError(i));
        ply.write(getScanConf(i));
      }
    }

    if (all && hasScanPos() != 0)
    {
      ply.write(getScanPosComp(i, 0));
      ply.write(getScanPosComp(i, 1));
      ply.write(getScanPosComp(i, 2));
    }

    if (all)
    {
      ply.write(getNormalComp(i, 0));
      ply.write(getNormalComp(i, 1));
      ply.write(getNormalComp(i, 2));
    }

    ply.write(getColorComp(i, 0));
    ply.write(getColorComp(i, 1));
    ply.write(getColorComp(i, 2));
  }

  for (int i=0; i<getTriangleCount(); i++)
  {
    ply.writeListSize(3);
    ply.write(getTriangleIndex(i, 0));
    ply.write(getTriangleIndex(i, 1));
    ply.write(getTriangleIndex(i, 2));
  }

  ply.close();
}